

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O3

void __thiscall
irr::scene::CSceneManager::getSceneNodesFromType
          (CSceneManager *this,ESCENE_NODE_TYPE type,array<irr::scene::ISceneNode_*> *outNodes,
          ISceneNode *start)

{
  int iVar1;
  ESCENE_NODE_TYPE EVar2;
  undefined4 extraout_var;
  _List_node_base *p_Var3;
  ISceneNode *pIVar4;
  ISceneNode *local_30;
  
  local_30 = start;
  if (start == (ISceneNode *)0x0) {
    iVar1 = (*(this->super_ISceneManager)._vptr_ISceneManager[9])(this);
    local_30 = (ISceneNode *)CONCAT44(extraout_var,iVar1);
  }
  pIVar4 = local_30;
  EVar2 = (*local_30->_vptr_ISceneNode[0x21])(local_30);
  if ((type == ESNT_ANY) || (EVar2 == type)) {
    core::array<irr::scene::ISceneNode_*>::push_back(outNodes,&local_30);
    pIVar4 = local_30;
  }
  for (p_Var3 = (pIVar4->Children).
                super__List_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var3 != (_List_node_base *)&pIVar4->Children; p_Var3 = p_Var3->_M_next) {
    (*(this->super_ISceneManager)._vptr_ISceneManager[0xd])(this,type,outNodes,p_Var3[1]._M_next);
  }
  return;
}

Assistant:

void CSceneManager::getSceneNodesFromType(ESCENE_NODE_TYPE type, core::array<scene::ISceneNode *> &outNodes, ISceneNode *start)
{
	if (start == 0)
		start = getRootSceneNode();

	if (start->getType() == type || ESNT_ANY == type)
		outNodes.push_back(start);

	const ISceneNodeList &list = start->getChildren();
	ISceneNodeList::const_iterator it = list.begin();

	for (; it != list.end(); ++it) {
		getSceneNodesFromType(type, outNodes, *it);
	}
}